

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall cmCPackGenerator::PrepareNames(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  string *this_00;
  allocator local_60d;
  uint local_60c;
  string tempDirectory;
  char *local_5e8 [4];
  ostringstream cmCPackLog_msg;
  uint auStack_5a8 [122];
  string outName;
  ostringstream ostr;
  string destFile;
  string line;
  string topDirectory;
  string outFile;
  ostringstream cmCPackLog_msg_10;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
  poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Create temp directory.");
  std::endl<char,std::char_traits<char>>(poVar4);
  pcVar1 = this->Logger;
  std::__cxx11::stringbuf::str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x45,_ostr);
  std::__cxx11::string::~string((string *)&ostr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_SET_DESTDIR",(allocator *)&ostr);
  bVar2 = IsOn(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (bVar2) {
    iVar3 = (*(this->super_cmObject)._vptr_cmObject[0x15])(this);
    if (iVar3 == 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "CPACK_SET_DESTDIR is set to ON but the \'");
      poVar4 = std::operator<<(poVar4,(string *)&this->Name);
      poVar4 = std::operator<<(poVar4,"\' generator does NOT support it.");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x4f,_ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      return 0;
    }
    iVar3 = (*(this->super_cmObject)._vptr_cmObject[0x15])(this);
    if (iVar3 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,
                               "CPACK_SET_DESTDIR is set to ON but it is ");
      poVar4 = std::operator<<(poVar4,"usually a bad idea to do that with \'");
      poVar4 = std::operator<<(poVar4,(string *)&this->Name);
      poVar4 = std::operator<<(poVar4,"\' generator. Use at your own risk.");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x58,_ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    }
  }
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_DIRECTORY",(allocator *)&ostr);
  pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&tempDirectory,pcVar5,(allocator *)&cmCPackLog_msg_10);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::append((char *)&tempDirectory);
  std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_TAG",(allocator *)&ostr);
  pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar5 != (char *)0x0) {
    std::__cxx11::string::append((char *)&tempDirectory);
    std::__cxx11::string::append((char *)&tempDirectory);
  }
  std::__cxx11::string::string((string *)&cmCPackLog_msg,"CPACK_GENERATOR",(allocator *)&ostr);
  GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::append((char *)&tempDirectory);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  std::__cxx11::string::string((string *)&topDirectory,(string *)&tempDirectory);
  std::__cxx11::string::string
            ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_FILE_NAME",(allocator *)&ostr);
  pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  if (pcVar5 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"CPACK_PACKAGE_FILE_NAME not specified");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x6a,_ostr);
    std::__cxx11::string::~string((string *)&ostr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    iVar3 = 0;
    goto LAB_0027814e;
  }
  std::__cxx11::string::string((string *)&outName,pcVar5,(allocator *)&cmCPackLog_msg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &cmCPackLog_msg,"/",&outName);
  std::__cxx11::string::append((string *)&tempDirectory);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg);
  iVar3 = (*(this->super_cmObject)._vptr_cmObject[5])(this);
  if (CONCAT44(extraout_var,iVar3) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"No output extension specified");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x72,_ostr);
LAB_00277e1e:
    std::__cxx11::string::~string((string *)&ostr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    iVar3 = 0;
  }
  else {
    (*(this->super_cmObject)._vptr_cmObject[5])(this);
    std::__cxx11::string::append((char *)&outName);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_DIRECTORY",(allocator *)&ostr);
    pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar5 == (char *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"CPACK_PACKAGE_DIRECTORY not specified");
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x7a,_ostr);
      goto LAB_00277e1e;
    }
    std::__cxx11::string::string((string *)&destFile,pcVar5,(allocator *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_PREFIX",(allocator *)&ostr);
    SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,destFile._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,"/",&outName);
    std::__cxx11::string::append((string *)&destFile);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg,&topDirectory,"/");
    std::operator+(&outFile,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &cmCPackLog_msg,&outName);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&ostr);
    SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,topDirectory._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_DIRECTORY",(allocator *)&ostr);
    SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,tempDirectory._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_NAME",(allocator *)&ostr);
    SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,outName._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_OUTPUT_FILE_PATH",(allocator *)&ostr);
    SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,destFile._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",(allocator *)&ostr);
    SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,outFile._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_INSTALL_DIRECTORY",(allocator *)&ostr);
    iVar3 = (*(this->super_cmObject)._vptr_cmObject[0xb])(this);
    SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,(char *)CONCAT44(extraout_var_00,iVar3));
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_NATIVE_INSTALL_DIRECTORY",(allocator *)&line);
    iVar3 = (*(this->super_cmObject)._vptr_cmObject[0xb])(this);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg_10,(char *)CONCAT44(extraout_var_01,iVar3),
               (allocator *)local_5e8);
    cmsys::SystemTools::ConvertToOutputPath((string *)&ostr,(string *)&cmCPackLog_msg_10);
    SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,_ostr);
    std::__cxx11::string::~string((string *)&ostr);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_10);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_TEMPORARY_INSTALL_DIRECTORY",(allocator *)&ostr);
    SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,tempDirectory._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Look for: CPACK_PACKAGE_DESCRIPTION_FILE");
    std::endl<char,std::char_traits<char>>(poVar4);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x8f,_ostr);
    std::__cxx11::string::~string((string *)&ostr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::string
              ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_DESCRIPTION_FILE",(allocator *)&ostr);
    pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (pcVar5 == (char *)0x0) {
LAB_0027803f:
      std::__cxx11::string::string
                ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_DESCRIPTION",(allocator *)&ostr);
      pcVar5 = GetOption(this,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (pcVar5 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "Project description not specified. Please specify CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
                                );
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0xb4,_ostr);
LAB_0027810e:
        std::__cxx11::string::~string((string *)&ostr);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        iVar3 = 0;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&cmCPackLog_msg,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",(allocator *)&ostr);
        SetOptionIfNotSet(this,(string *)&cmCPackLog_msg,"1");
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        iVar3 = 1;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Look for: ");
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x95,_ostr);
      std::__cxx11::string::~string((string *)&ostr);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      bVar2 = cmsys::SystemTools::FileExists(pcVar5);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar4 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot find description file name: [");
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"]");
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x9a,_ostr);
        goto LAB_0027810e;
      }
      std::ifstream::ifstream(&cmCPackLog_msg,pcVar5,_S_in);
      local_60c = *(uint *)((long)auStack_5a8 + *(long *)(_cmCPackLog_msg + -0x18));
      if ((local_60c & 5) == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        line.field_2._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_10);
        poVar4 = std::operator<<((ostream *)&cmCPackLog_msg_10,"Read description file: ");
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,2,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0xa8,local_5e8[0]);
        std::__cxx11::string::~string((string *)local_5e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_10);
        while (((*(byte *)((long)auStack_5a8 + *(long *)(_cmCPackLog_msg + -0x18)) & 5) == 0 &&
               (bVar2 = cmsys::SystemTools::GetLineFromStream
                                  ((istream *)&cmCPackLog_msg,&line,(bool *)0x0,-1), bVar2))) {
          cmXMLSafe::cmXMLSafe((cmXMLSafe *)&cmCPackLog_msg_10,&line);
          poVar4 = operator<<((ostream *)&ostr,(cmXMLSafe *)&cmCPackLog_msg_10);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        std::__cxx11::string::string
                  ((string *)&cmCPackLog_msg_10,"CPACK_PACKAGE_DESCRIPTION",&local_60d);
        std::__cxx11::stringbuf::str();
        SetOptionIfNotSet(this,(string *)&cmCPackLog_msg_10,local_5e8[0]);
        std::__cxx11::string::~string((string *)local_5e8);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg_10);
        this_00 = &line;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ostr);
        poVar4 = std::operator<<((ostream *)&ostr,"Cannot open description file name: ");
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::endl<char,std::char_traits<char>>(poVar4);
        pcVar1 = this->Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                        ,0xa1,_cmCPackLog_msg_10);
        this_00 = (string *)&cmCPackLog_msg_10;
      }
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ostr);
      std::ifstream::~ifstream(&cmCPackLog_msg);
      iVar3 = 0;
      if ((local_60c & 5) == 0) goto LAB_0027803f;
    }
    std::__cxx11::string::~string((string *)&outFile);
    std::__cxx11::string::~string((string *)&destFile);
  }
  std::__cxx11::string::~string((string *)&outName);
LAB_0027814e:
  std::__cxx11::string::~string((string *)&topDirectory);
  std::__cxx11::string::~string((string *)&tempDirectory);
  return iVar3;
}

Assistant:

int cmCPackGenerator::PrepareNames()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
    "Create temp directory." << std::endl);

  // checks CPACK_SET_DESTDIR support
  if (IsOn("CPACK_SET_DESTDIR"))
    {
      if (SETDESTDIR_UNSUPPORTED==SupportsSetDestdir())
        {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "CPACK_SET_DESTDIR is set to ON but the '"
                        << Name << "' generator does NOT support it."
                        << std::endl);
          return 0;
        }
      else if (SETDESTDIR_SHOULD_NOT_BE_USED==SupportsSetDestdir())
        {
          cmCPackLogger(cmCPackLog::LOG_WARNING,
                        "CPACK_SET_DESTDIR is set to ON but it is "
                        << "usually a bad idea to do that with '"
                        << Name << "' generator. Use at your own risk."
                        << std::endl);
        }
  }

  std::string tempDirectory = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  tempDirectory += "/_CPack_Packages/";
  const char* toplevelTag = this->GetOption("CPACK_TOPLEVEL_TAG");
  if ( toplevelTag )
    {
    tempDirectory += toplevelTag;
    tempDirectory += "/";
    }
  tempDirectory += this->GetOption("CPACK_GENERATOR");
  std::string topDirectory = tempDirectory;
  const char* pfname = this->GetOption("CPACK_PACKAGE_FILE_NAME");
  if(!pfname)
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_FILE_NAME not specified" << std::endl);
    return 0;
    }
  std::string outName = pfname;
  tempDirectory += "/" + outName;
  if(!this->GetOutputExtension())
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "No output extension specified" << std::endl);
    return 0;
    }
  outName += this->GetOutputExtension();
  const char* pdir = this->GetOption("CPACK_PACKAGE_DIRECTORY");
  if(!pdir)
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPACK_PACKAGE_DIRECTORY not specified" << std::endl);
    return 0;
    }

  std::string destFile = pdir;
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PREFIX", destFile.c_str());
  destFile += "/" + outName;
  std::string outFile = topDirectory + "/" + outName;
  this->SetOptionIfNotSet("CPACK_TOPLEVEL_DIRECTORY", topDirectory.c_str());
  this->SetOptionIfNotSet("CPACK_TEMPORARY_DIRECTORY", tempDirectory.c_str());
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_NAME", outName.c_str());
  this->SetOptionIfNotSet("CPACK_OUTPUT_FILE_PATH", destFile.c_str());
  this->SetOptionIfNotSet("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                          outFile.c_str());
  this->SetOptionIfNotSet("CPACK_INSTALL_DIRECTORY", this->GetInstallPath());
  this->SetOptionIfNotSet("CPACK_NATIVE_INSTALL_DIRECTORY",
    cmsys::SystemTools::ConvertToOutputPath(this->GetInstallPath()).c_str());
  this->SetOptionIfNotSet("CPACK_TEMPORARY_INSTALL_DIRECTORY",
                          tempDirectory.c_str());

  cmCPackLogger(cmCPackLog::LOG_DEBUG,
    "Look for: CPACK_PACKAGE_DESCRIPTION_FILE" << std::endl);
  const char* descFileName
    = this->GetOption("CPACK_PACKAGE_DESCRIPTION_FILE");
  if ( descFileName )
    {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Look for: " << descFileName << std::endl);
    if ( !cmSystemTools::FileExists(descFileName) )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Cannot find description file name: ["
                    << descFileName << "]" << std::endl);
      return 0;
      }
    cmsys::ifstream ifs(descFileName);
    if ( !ifs )
      {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
        "Cannot open description file name: " << descFileName << std::endl);
      return 0;
      }
    std::ostringstream ostr;
    std::string line;

    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
      "Read description file: " << descFileName << std::endl);
    while ( ifs && cmSystemTools::GetLineFromStream(ifs, line) )
      {
      ostr << cmXMLSafe(line) << std::endl;
      }
    this->SetOptionIfNotSet("CPACK_PACKAGE_DESCRIPTION", ostr.str().c_str());
    }
  if ( !this->GetOption("CPACK_PACKAGE_DESCRIPTION") )
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
      "Project description not specified. Please specify "
      "CPACK_PACKAGE_DESCRIPTION or CPACK_PACKAGE_DESCRIPTION_FILE."
      << std::endl);
    return 0;
    }

  this->SetOptionIfNotSet("CPACK_REMOVE_TOPLEVEL_DIRECTORY", "1");

  return 1;
}